

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rectlight.cpp
# Opt level: O3

double __thiscall RectLight::getShadowRatio(RectLight *this,Scene *scene,Vector3 *p)

{
  int iVar1;
  int iVar2;
  pointer ppOVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double x;
  Vector3 dir;
  Vector3 c;
  Collision coll;
  int local_134;
  Vector3 local_f0;
  Vector3 local_d8;
  Vector3 local_c0;
  Vector3 local_a8 [4];
  double local_38;
  
  iVar2 = 0;
  dVar4 = 0.0;
  local_134 = 0x10;
  do {
    dVar5 = 0.0;
    iVar1 = 0;
    do {
      Vector3::operator*(&local_d8,&this->m_dx,(dVar4 + 0.5 + dVar4 + 0.5) * 0.25 + -1.0);
      operator+(&this->m_o,&local_d8);
      Vector3::operator*(&local_f0,&this->m_dy,(dVar5 + 0.5 + dVar5 + 0.5) * 0.25 + -1.0);
      operator+(local_a8,&local_f0);
      operator-(&local_c0,p);
      dVar6 = Vector3::mod(&local_d8);
      ppOVar3 = (scene->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppOVar3 !=
          (scene->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          (*(*ppOVar3)->_vptr_Object[2])(local_a8,*ppOVar3,p,&local_d8);
          if ((local_38 < 1000000000.0) && (local_38 + 1e-06 < dVar6)) {
            local_134 = local_134 + -1;
            break;
          }
          ppOVar3 = ppOVar3 + 1;
        } while (ppOVar3 !=
                 (scene->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      dVar5 = dVar5 + 1.0;
      iVar1 = iVar1 + 1;
    } while (iVar1 != 4);
    dVar4 = dVar4 + 1.0;
    iVar2 = iVar2 + 1;
    if (iVar2 == 4) {
      return (double)local_134 * 0.25 * 0.25;
    }
  } while( true );
}

Assistant:

double RectLight::getShadowRatio(const Scene* scene, const Vector3& p) const
{
    int ret = SHADOW_SAMPLE * SHADOW_SAMPLE;
    for (int i = 0; i < SHADOW_SAMPLE; i++)
        for (int j = 0; j < SHADOW_SAMPLE; j++)
        {
            double x = (i + 0.5) * 2 / SHADOW_SAMPLE - 1,
                   y = (j + 0.5) * 2 / SHADOW_SAMPLE - 1;
            Vector3 c = m_o + m_dx * x + m_dy * y, dir = c - p;
            double dist = dir.mod();

            for (auto o = scene->objectsBegin(); o != scene->objectsEnd(); o++)
            {
                Collision coll = (*o)->collide(p, dir);
                if (coll.isHit() && coll.dist + Const::EPS < dist)
                {
                    ret--;
                    break;
                }
            }
        }
    return 1.0 * ret / SHADOW_SAMPLE / SHADOW_SAMPLE;
}